

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O3

ostream * operator<<(ostream *out,pair<double,_double> *pair)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"[",1);
  poVar1 = std::ostream::_M_insert<double>(pair->first);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  poVar1 = std::ostream::_M_insert<double>(pair->second);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return out;
}

Assistant:

std::ostream &operator<<(std::ostream &out, const std::pair<U, V> &pair)
{
    out << "[" << pair.first << ", " << pair.second << "]" << std::endl;
    return out;
}